

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::Track::Create
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               Track **pResult)

{
  int iVar1;
  Track *this;
  Track *local_68;
  int status;
  Track *pTrack;
  Track **pResult_local;
  longlong element_size_local;
  longlong element_start_local;
  Info *info_local;
  Segment *pSegment_local;
  
  if (*pResult == (Track *)0x0) {
    this = (Track *)operator_new(0xc0,(nothrow_t *)&std::nothrow);
    local_68 = (Track *)0x0;
    if (this != (Track *)0x0) {
      Track(this,pSegment,element_start,element_size);
      local_68 = this;
    }
    if (local_68 == (Track *)0x0) {
      pSegment_local = (Segment *)0xffffffffffffffff;
    }
    else {
      iVar1 = Info::Copy(info,&local_68->m_info);
      if (iVar1 == 0) {
        *pResult = local_68;
        pSegment_local = (Segment *)0x0;
      }
      else {
        if (local_68 != (Track *)0x0) {
          (*local_68->_vptr_Track[1])();
        }
        pSegment_local = (Segment *)(long)iVar1;
      }
    }
  }
  else {
    pSegment_local = (Segment *)0xffffffffffffffff;
  }
  return (long)pSegment_local;
}

Assistant:

long Track::Create(Segment* pSegment, const Info& info, long long element_start,
                   long long element_size, Track*& pResult) {
  if (pResult)
    return -1;

  Track* const pTrack =
      new (std::nothrow) Track(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {  // error
    delete pTrack;
    return status;
  }

  pResult = pTrack;
  return 0;  // success
}